

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O2

void __thiscall
SQCompilation::CodegenVisitor::emitAssign(CodegenVisitor *this,Expr *lvalue,Expr *rvalue)

{
  SQUnsignedInteger *pSVar1;
  TreeOp TVar2;
  SQFuncState *this_00;
  bool bVar3;
  SQInteger SVar4;
  SQInteger SVar5;
  SQInteger arg0;
  FieldAccessExpr *fieldAccess;
  bool assignable;
  SQObject nameObj;
  
  if ((((lvalue->super_Node)._op - TO_GETFIELD < 4) &&
      (*(int *)(lvalue[1].super_Node.super_ArenaObj._vptr_ArenaObj + 3) != 0x3a)) &&
     (bVar3 = canBeLiteral(this,(AccessExpr *)lvalue), bVar3)) {
    nameObj = SQFuncState::CreateString
                        (this->_fs,*(SQChar **)&lvalue[1].super_Node._coordinates.lineEnd,-1);
    SVar4 = SQFuncState::GetConstant(this->_fs,&nameObj,0x7fffffff);
    visitForceGet(this,(Node *)lvalue[1].super_Node.super_ArenaObj._vptr_ArenaObj);
    visitForceGet(this,&rvalue->super_Node);
    emitFieldAssign(this,(int)SVar4);
    return;
  }
  visitNoGet(this,&lvalue->super_Node);
  visitForceGet(this,&rvalue->super_Node);
  TVar2 = (lvalue->super_Node)._op;
  if (TVar2 == TO_ID) {
    nameObj = SQFuncState::CreateString
                        (this->_fs,(SQChar *)lvalue[1].super_Node.super_ArenaObj._vptr_ArenaObj,-1);
    if ((nameObj._type >> 0x1b & 1) != 0) {
      pSVar1 = &((nameObj._unVal.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                _uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    assignable = false;
    SVar4 = SQFuncState::GetLocalVariable(this->_fs,&nameObj,&assignable);
    if (SVar4 == -1) {
      SVar4 = SQFuncState::GetOuterVariable(this->_fs,&nameObj,&assignable);
      if (SVar4 == -1) {
        reportDiagnostic(this,&lvalue->super_Node,0x27);
      }
      else {
        if (assignable == false) {
          reportDiagnostic(this,&lvalue->super_Node,0x29,
                           lvalue[1].super_Node.super_ArenaObj._vptr_ArenaObj);
        }
        SVar5 = SQFuncState::PopTarget(this->_fs);
        this_00 = this->_fs;
        arg0 = SQFuncState::PushTarget(this_00,-1);
        SQFuncState::AddInstruction(this_00,_OP_SETOUTER,arg0,SVar4,SVar5,0);
      }
    }
    else {
      if (assignable == false) {
        reportDiagnostic(this,&lvalue->super_Node,0x29,
                         lvalue[1].super_Node.super_ArenaObj._vptr_ArenaObj);
      }
      SVar4 = SQFuncState::PopTarget(this->_fs);
      SVar5 = SQFuncState::TopTarget(this->_fs);
      SQFuncState::AddInstruction(this->_fs,_OP_MOVE,SVar5,SVar4,0,0);
    }
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&nameObj);
    return;
  }
  if ((TVar2 - TO_GETFIELD < 4) &&
     (*(int *)(lvalue[1].super_Node.super_ArenaObj._vptr_ArenaObj + 3) != 0x3a)) {
    emitFieldAssign(this,-1);
    return;
  }
  reportDiagnostic(this,&lvalue->super_Node,0x27);
  return;
}

Assistant:

void CodegenVisitor::emitAssign(Expr *lvalue, Expr * rvalue) {

    if (lvalue->isAccessExpr() && lvalue->asAccessExpr()->receiver()->op() != TO_BASE && canBeLiteral(lvalue->asAccessExpr())) {
        FieldAccessExpr *fieldAccess = lvalue->asAccessExpr()->asFieldAccessExpr();
        SQObject nameObj = _fs->CreateString(fieldAccess->fieldName());
        SQInteger constantI = _fs->GetConstant(nameObj);
        // arg1 is of int size, enough
        visitForceGet(fieldAccess->receiver());

        visitForceGet(rvalue);

        emitFieldAssign(constantI);
        return;
    }

    visitNoGet(lvalue);

    visitForceGet(rvalue);

    if (lvalue->op() == TO_ID) {
        Id *id = lvalue->asId();

        SQObjectPtr nameObj = _fs->CreateString(id->id());
        bool assignable = false;
        SQInteger pos = -1;

        if ((pos = _fs->GetLocalVariable(nameObj, assignable)) != -1) {
            if (!assignable)
                reportDiagnostic(lvalue, DiagnosticsId::DI_ASSIGN_TO_BINDING, id->id());

            SQInteger src = _fs->PopTarget();
            SQInteger dst = _fs->TopTarget();
            _fs->AddInstruction(_OP_MOVE, dst, src);
        }
        else if ((pos = _fs->GetOuterVariable(nameObj, assignable)) != -1) {
            if (!assignable)
                reportDiagnostic(lvalue, DiagnosticsId::DI_ASSIGN_TO_BINDING, id->id());

            SQInteger src = _fs->PopTarget();
            _fs->AddInstruction(_OP_SETOUTER, _fs->PushTarget(), pos, src);
        }
        else {
            reportDiagnostic(lvalue, DiagnosticsId::DI_ASSIGN_TO_EXPR);
        }
    }
    else if (lvalue->isAccessExpr()) {
        if (lvalue->asAccessExpr()->receiver()->op() != TO_BASE) {
            emitFieldAssign(-1);
        }
        else {
            reportDiagnostic(lvalue, DiagnosticsId::DI_ASSIGN_TO_EXPR);
        }
    }
    else {
        reportDiagnostic(lvalue, DiagnosticsId::DI_ASSIGN_TO_EXPR);
    }
}